

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O1

String * __thiscall
Diligent::BasicPlatformDebug::FormatDebugMessage_abi_cxx11_
          (String *__return_storage_ptr__,BasicPlatformDebug *this,DEBUG_MESSAGE_SEVERITY Severity,
          Char *Message,char *Function,char *File,int Line)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  char *__s_00;
  stringstream msg_ss;
  char local_1bd;
  int local_1bc;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1bc = (int)File;
  __s_00 = (char *)CONCAT44(in_register_00000014,Severity);
  std::__cxx11::stringstream::stringstream(local_1b8);
  __s = FormatDebugMessage::strSeverities[(int)this];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Diligent Engine: ",0x11);
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
  if (Message != (Char *)0x0 || Function != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," in ",4);
    if (Message != (Char *)0x0) {
      sVar1 = strlen(Message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,Message,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"()",2);
      if (Function == (char *)0x0) goto LAB_00523067;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
    }
    if (Function != (char *)0x0) {
      sVar1 = strlen(Function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,Function,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_1bc);
      local_1bd = ')';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1bd,1);
    }
  }
LAB_00523067:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar1);
  }
  local_1bd = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1bd,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

String BasicPlatformDebug::FormatDebugMessage(DEBUG_MESSAGE_SEVERITY Severity,
                                              const Char*            Message,
                                              const char*            Function, // type of __FUNCTION__
                                              const char*            File,     // type of __FILE__
                                              int                    Line)
{
    std::stringstream msg_ss;

    static const Char* const strSeverities[] = {"Info", "Warning", "ERROR", "CRITICAL ERROR"};
    const auto*              MessageSevery   = strSeverities[static_cast<int>(Severity)];

    msg_ss << "Diligent Engine: " << MessageSevery;
    if (Function != nullptr || File != nullptr)
    {
        msg_ss << " in ";
        if (Function != nullptr)
        {
            msg_ss << Function << "()";
            if (File != nullptr)
                msg_ss << " (";
        }

        if (File != nullptr)
        {
            msg_ss << File << ", " << Line << ')';
        }
    }
    msg_ss << ": " << Message << '\n';

    return msg_ss.str();
}